

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# econf_error.c
# Opt level: O2

char * econf_errString(econf_err error)

{
  char *pcVar1;
  
  if (error < (ECONF_VALUE_CONVERSION_ERROR|ECONF_ERROR)) {
    pcVar1 = messages_rel + *(int *)(messages_rel + (ulong)error * 4);
  }
  else {
    pcVar1 = econf_errString::buffer;
    snprintf(econf_errString::buffer,0x400,"Unknown libeconf error %i");
  }
  return pcVar1;
}

Assistant:

const char *
econf_errString (const econf_err error)
{
  if (error >= sizeof(messages)/sizeof(messages[0]))
    {
      static char buffer[1024]; /* should always be big enough, else truncate */
      const char *unknown = "Unknown libeconf error %i";

      snprintf (buffer, sizeof (buffer), unknown, error);

      return buffer;
    }
  else
    return messages[error];
}